

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat operator*(Mat *left,Mat *right)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  double *pdVar4;
  double *pdVar5;
  double *in_RDX;
  double *extraout_RDX;
  double *pdVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double *pdVar12;
  ulong uVar13;
  double dVar14;
  Mat MVar15;
  
  uVar1 = right->n_rows_;
  uVar2 = *(uint *)((long)in_RDX + 4);
  uVar11 = (ulong)uVar2;
  left->n_rows_ = uVar1;
  left->n_cols_ = uVar2;
  if ((int)(uVar2 * uVar1) < 1) {
    pdVar5 = (double *)0x0;
    pdVar6 = in_RDX;
  }
  else {
    pdVar5 = (double *)operator_new__((ulong)(uVar2 * uVar1) << 3);
    pdVar6 = extraout_RDX;
  }
  left->v_ = pdVar5;
  if (0 < (int)uVar1) {
    uVar3 = right->n_cols_;
    pdVar6 = right->v_;
    pdVar4 = (double *)in_RDX[1];
    uVar9 = 0;
    uVar10 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar13 = 0;
        pdVar12 = pdVar4;
        do {
          dVar14 = 0.0;
          if (0 < (int)uVar3) {
            uVar7 = 0;
            pdVar8 = pdVar12;
            do {
              dVar14 = dVar14 + pdVar6[uVar9 + uVar7] * *pdVar8;
              uVar7 = uVar7 + 1;
              pdVar8 = pdVar8 + uVar11;
            } while (uVar3 != uVar7);
          }
          pdVar5[uVar13 + uVar10 * uVar11] = dVar14;
          uVar13 = uVar13 + 1;
          pdVar12 = pdVar12 + 1;
        } while (uVar13 != uVar11);
      }
      uVar10 = uVar10 + 1;
      uVar9 = (ulong)((int)uVar9 + uVar3);
    } while (uVar10 != uVar1);
  }
  MVar15.v_ = pdVar6;
  MVar15._0_8_ = left;
  return MVar15;
}

Assistant:

Mat operator * (const Mat& left, const Mat& right)
{
	Mat Aux(left.n_rows_, right.n_cols_);
	double Sum;
	for (int i=0; i<left.n_rows_; i++) 
		for (int j=0; j<right.n_cols_; j++)
		{
			Sum = 0.0;
			for (int k=0; k<left.n_cols_; k++) 
			Sum += left.v_[i*left.n_cols_+k] * right.v_[k*right.n_cols_+j];
			Aux.v_[i*Aux.n_cols_+j] = Sum;
		}
	return Aux;
}